

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void MetaEnumClass(nodeclass *Class,array *List)

{
  ulong local_28;
  dataid Id;
  nodemeta *m;
  array *List_local;
  nodeclass *Class_local;
  
  m = (nodemeta *)List;
  List_local = (array *)Class;
  if (Class->ParentClass != (nodeclass *)0x0) {
    MetaEnumClass(Class->ParentClass,List);
  }
  if (List_local->_Used != 0) {
    for (Id = List_local->_Used; (*(uint *)Id & 0xff) != 0; Id = Id + 0x10) {
      if ((*(uint *)Id & 0xff) == 0x1f) {
        local_28 = (ulong)(*(uint *)Id >> 8);
        ArrayAppend((array *)m,&local_28,8,0x100);
      }
    }
  }
  return;
}

Assistant:

static NOINLINE void MetaEnumClass(const nodeclass* Class,array* List)
{
    if (Class->ParentClass)
        MetaEnumClass(Class->ParentClass,List);

    if (Class->Meta)
    {
        const nodemeta* m;
        for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_PARAM_TYPE)
            {
                dataid Id = m->Id;
                ArrayAppend(List,&Id,sizeof(Id),256);
            }
    }
}